

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_1::PosixEnv::StartThread
          (PosixEnv *this,_func_void_void_ptr *thread_main,void *thread_main_arg)

{
  thread local_28;
  thread new_thread;
  void *thread_main_arg_local;
  _func_void_void_ptr *thread_main_local;
  PosixEnv *this_local;
  
  new_thread._M_id._M_thread = (id)(id)thread_main_arg;
  thread_main_arg_local = thread_main;
  thread_main_local = (_func_void_void_ptr *)this;
  std::thread::thread<void(*&)(void*),void*&,void>
            (&local_28,(_func_void_void_ptr **)&thread_main_arg_local,(void **)&new_thread);
  std::thread::detach();
  std::thread::~thread(&local_28);
  return;
}

Assistant:

void PosixEnv::StartThread(void (*thread_main)(void* thread_main_arg),
                           void* thread_main_arg) {
  std::thread new_thread(thread_main, thread_main_arg);
  new_thread.detach();
}